

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImVec2 *lhs;
  ImVec2 *uv_min;
  ImVec2 *uv_max;
  ImFontAtlas *this;
  ImTextureID pvVar1;
  bool bVar2;
  ImVec2 *local_120;
  bool local_111;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImTextureID local_70;
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  ImU32 col_shadow_local;
  ImU32 col_border_local;
  ImU32 col_fill_local;
  ImGuiMouseCursor mouse_cursor_local;
  float scale_local;
  ImDrawList *draw_list_local;
  ImVec2 pos_local;
  
  if (mouse_cursor != -1) {
    local_111 = 7 < (uint)mouse_cursor;
    draw_list_local = (ImDrawList *)pos;
    if (local_111) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                    ,0xbe5,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    ImVec2::ImVec2(&size);
    ImVec2::ImVec2(uv + 3);
    local_120 = (ImVec2 *)&tex_id;
    do {
      ImVec2::ImVec2(local_120);
      local_120 = local_120 + 1;
    } while (local_120 != uv + 3);
    bVar2 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&size,uv + 3,(ImVec2 *)&tex_id,uv + 1);
    if (bVar2) {
      operator-=((ImVec2 *)&draw_list_local,&size);
      local_70 = this->TexID;
      ImDrawList::PushTextureID(draw_list,local_70);
      pvVar1 = local_70;
      ImVec2::ImVec2(&local_88,1.0,0.0);
      local_80 = ::operator*(&local_88,scale);
      local_78 = operator+((ImVec2 *)&draw_list_local,&local_80);
      ImVec2::ImVec2(&local_a8,1.0,0.0);
      local_a0 = ::operator*(&local_a8,scale);
      local_98 = operator+((ImVec2 *)&draw_list_local,&local_a0);
      lhs = uv + 3;
      local_b0 = ::operator*(lhs,scale);
      local_90 = operator+(&local_98,&local_b0);
      uv_min = uv + 1;
      uv_max = uv + 2;
      ImDrawList::AddImage(draw_list,pvVar1,&local_78,&local_90,uv_min,uv_max,col_shadow);
      pvVar1 = local_70;
      ImVec2::ImVec2(&local_c8,2.0,0.0);
      local_c0 = ::operator*(&local_c8,scale);
      local_b8 = operator+((ImVec2 *)&draw_list_local,&local_c0);
      ImVec2::ImVec2(&local_e8,2.0,0.0);
      local_e0 = ::operator*(&local_e8,scale);
      local_d8 = operator+((ImVec2 *)&draw_list_local,&local_e0);
      local_f0 = ::operator*(lhs,scale);
      local_d0 = operator+(&local_d8,&local_f0);
      ImDrawList::AddImage(draw_list,pvVar1,&local_b8,&local_d0,uv_min,uv_max,col_shadow);
      pvVar1 = local_70;
      local_100 = ::operator*(lhs,scale);
      local_f8 = operator+((ImVec2 *)&draw_list_local,&local_100);
      ImDrawList::AddImage
                (draw_list,pvVar1,(ImVec2 *)&draw_list_local,&local_f8,uv_min,uv_max,col_border);
      pvVar1 = local_70;
      local_110 = ::operator*(lhs,scale);
      local_108 = operator+((ImVec2 *)&draw_list_local,&local_110);
      ImDrawList::AddImage
                (draw_list,pvVar1,(ImVec2 *)&draw_list_local,&local_108,(ImVec2 *)&tex_id,uv,
                 col_fill);
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}